

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

bool __thiscall Catch::TestSpecParser::processNoneChar(TestSpecParser *this,char c)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,c);
  if (iVar1 < 0x5b) {
    if (iVar1 == 0x20) {
      return true;
    }
    if (iVar1 == 0x22) {
      this->m_mode = QuotedName;
      return false;
    }
  }
  else {
    if (iVar1 == 0x5b) {
      this->m_mode = Tag;
      return false;
    }
    if (iVar1 == 0x7e) {
      this->m_exclusion = true;
      return false;
    }
  }
  this->m_mode = Name;
  return false;
}

Assistant:

bool TestSpecParser::processNoneChar( char c ) {
        switch( c ) {
        case ' ':
            return true;
        case '~':
            m_exclusion = true;
            return false;
        case '[':
            startNewMode( Tag );
            return false;
        case '"':
            startNewMode( QuotedName );
            return false;
        default:
            startNewMode( Name );
            return false;
        }
    }